

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iomapper.cpp
# Opt level: O0

uint32_t __thiscall
glslang::TDefaultIoResolverBase::computeTypeLocationSize
          (TDefaultIoResolverBase *this,TType *type,EShLanguage stage)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined1 local_b8 [8];
  TType elementType;
  int typeLocationSize;
  EShLanguage stage_local;
  TType *type_local;
  TDefaultIoResolverBase *this_local;
  
  elementType.spirvType._4_4_ = stage;
  iVar2 = (*type->_vptr_TType[0xb])();
  bVar1 = TQualifier::isArrayedIo
                    ((TQualifier *)CONCAT44(extraout_var,iVar2),elementType.spirvType._4_4_);
  if (bVar1) {
    TType::TType((TType *)local_b8,type,0,false);
    elementType.spirvType._0_4_ =
         TIntermediate::computeTypeLocationSize((TType *)local_b8,elementType.spirvType._4_4_);
    TType::~TType((TType *)local_b8);
  }
  else {
    elementType.spirvType._0_4_ =
         TIntermediate::computeTypeLocationSize(type,elementType.spirvType._4_4_);
  }
  return (uint32_t)elementType.spirvType;
}

Assistant:

uint32_t TDefaultIoResolverBase::computeTypeLocationSize(const TType& type, EShLanguage stage) {
    int typeLocationSize;
    // Don’t take into account the outer-most array if the stage’s
    // interface is automatically an array.
    if (type.getQualifier().isArrayedIo(stage)) {
        TType elementType(type, 0);
        typeLocationSize = TIntermediate::computeTypeLocationSize(elementType, stage);
    } else {
        typeLocationSize = TIntermediate::computeTypeLocationSize(type, stage);
    }
    return typeLocationSize;
}